

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void LowerCase(string *TextValue)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator uploop;
  string *TextValue_local;
  
  uploop._M_current = (char *)TextValue;
  local_18._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_20._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(&local_18,&local_20);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    iVar2 = tolower((int)*pcVar3);
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    *pcVar3 = (char)iVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void LowerCase(
	std::string& TextValue		/**< string to be converted (in place) to lower case */
)
{
	//
	// Force string to lower case so it's easier to handle
	//
	for (std::string::iterator uploop = TextValue.begin();
		uploop < TextValue.end(); uploop++)
	{
		*uploop = tolower(*uploop);
	}
}